

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::resize_symms(Omega_h *this,Reals *old_symms,Int old_dim,Int new_dim)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Write<double> *this_00;
  Reals RVar2;
  Write<double> local_30;
  Write<double> local_20;
  
  if (old_dim == new_dim) {
    Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)old_symms);
    pvVar1 = extraout_RDX;
  }
  else {
    if (new_dim == 3 && old_dim == 2) {
      Write<double>::Write(&local_20,&old_symms->write_);
      resize_symms_tmpl<2,3>(this,(Reals *)&local_20);
      this_00 = &local_20;
    }
    else {
      if ((old_dim != 3) || (new_dim != 2)) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
             ,0x26);
      }
      Write<double>::Write(&local_30,&old_symms->write_);
      resize_symms_tmpl<3,2>(this,(Reals *)&local_30);
      this_00 = &local_30;
    }
    Write<double>::~Write(this_00);
    pvVar1 = extraout_RDX_00;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals resize_symms(Reals old_symms, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_symms;
  if (old_dim == 2 && new_dim == 3) return resize_symms_tmpl<2, 3>(old_symms);
  if (old_dim == 3 && new_dim == 2) return resize_symms_tmpl<3, 2>(old_symms);
  OMEGA_H_NORETURN(Reals());
}